

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdFindSupportOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v,int u)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int jVar;
  int iVar;
  int Num2;
  
  iVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar3 = 1;
  }
  if (p == (Dau_Dsd_t *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)p->Cache[pVars[(uint)v]][pVars[u]];
  }
  if (uVar1 == 0) {
    if (v < u) {
      iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,v,u,1,3);
      Num2 = 2;
      iVar = v;
      jVar = u;
    }
    else {
      iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,2,3);
      Num2 = 1;
      iVar = u;
      jVar = v;
    }
    iVar3 = Abc_TtCheckEqualCofs(pTruth,iVar3,iVar,jVar,0,Num2);
    uVar1 = iVar3 + iVar2 * 2;
    if (uVar1 == 3) {
      __assert_fail("Status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x62f,"int Dau_DsdFindSupportOne(Dau_Dsd_t *, word *, int *, int, int, int)");
    }
    uVar1 = uVar1 ^ 3;
    if (p != (Dau_Dsd_t *)0x0) {
      iVar3 = pVars[(uint)v];
      iVar2 = pVars[u];
      if (iVar3 == iVar2) {
        __assert_fail("v != u",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x459,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
      }
      if (2 < uVar1 - 1) {
        __assert_fail("Status > 0 && Status < 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x45a,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
      }
      if (p->Cache[iVar3][iVar2] != '\0') {
        __assert_fail("p->Cache[v][u] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x45b,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
      }
      p->Cache[iVar3][iVar2] = (char)uVar1;
    }
  }
  return uVar1;
}

Assistant:

static inline int Dau_DsdFindSupportOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v, int u )
{
    int nWords = Abc_TtWordNum(nVars);
    int Status = p ? Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) : 0;
    if ( Status == 0 )
    {
//        Status = (Abc_Tt6HasVar(tCof1, u) << 1) | Abc_Tt6HasVar(tCof0, u);
        if ( v < u )
            Status = (!Abc_TtCheckEqualCofs(pTruth, nWords, v, u, 1, 3) << 1) | !Abc_TtCheckEqualCofs(pTruth, nWords, v, u, 0, 2);
        else // if ( v > u )
            Status = (!Abc_TtCheckEqualCofs(pTruth, nWords, u, v, 2, 3) << 1) | !Abc_TtCheckEqualCofs(pTruth, nWords, u, v, 0, 1);
        assert( Status != 0 );
        if ( p )
            Dau_DsdInsertVarCache( p, pVars[v], pVars[u], Status );
    }
    return Status;
}